

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadSemaphorePosix.cpp
# Opt level: O0

void __thiscall IlmThread_3_4::Semaphore::~Semaphore(Semaphore *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Semaphore_00113d28;
  sem_destroy((sem_t *)(in_RDI + 1));
  return;
}

Assistant:

Semaphore::~Semaphore ()
{
#    ifdef NDEBUG
    ::sem_destroy (&_semaphore);
#    else
    int error = ::sem_destroy (&_semaphore);
    assert (error == 0);
#    endif
}